

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O3

char __thiscall TextProviderString::advance(TextProviderString *this)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  _Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Var6;
  element_type *peVar7;
  uint __val;
  uint uVar8;
  int iVar9;
  long *plVar10;
  uint uVar11;
  long *plVar12;
  ulong uVar13;
  uint __len;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  bVar2 = (this->m_iterator).
          super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_engaged;
  if (bVar2 == false) {
    _Var6 = (_Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             )(this->m_text)._M_dataplus._M_p;
    (this->m_iterator).
    super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_engaged = true;
    (this->m_iterator).
    super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload = _Var6;
  }
  iVar9 = (*(this->super_TextProvider)._vptr_TextProvider[2])(this);
  if ((char)iVar9 != '\0') {
    piVar1 = &(this->super_TextProvider).m_current_char_idx;
    *piVar1 = *piVar1 + 1;
    bVar3 = (this->m_iterator).
            super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_engaged;
    if (bVar2 == false) {
      if ((bVar3 & 1U) == 0) goto LAB_00149d04;
    }
    else {
      if ((bVar3 & 1U) == 0) {
LAB_00149d04:
        std::__throw_bad_optional_access();
      }
      (this->m_iterator).
      super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_payload = (_Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     )((long)(this->m_iterator).
                             super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_payload + 1);
    }
    _Var6 = (this->m_iterator).
            super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_payload;
    if (_Var6 != (_Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  )((this->m_text)._M_dataplus._M_p + (this->m_text)._M_string_length)) {
      cVar4 = *(char *)_Var6;
      (this->super_TextProvider).m_current_char = cVar4;
      if (-1 < cVar4) {
        return cVar4;
      }
      peVar7 = (this->super_TextProvider).m_logger.
               super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,
                 TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_dataplus._M_p,
                 TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_dataplus._M_p +
                 TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_string_length);
      uVar5 = (this->super_TextProvider).m_current_char_idx;
      __val = -uVar5;
      if (0 < (int)uVar5) {
        __val = uVar5;
      }
      __len = 1;
      if (9 < __val) {
        uVar13 = (ulong)__val;
        uVar8 = 4;
        do {
          __len = uVar8;
          uVar11 = (uint)uVar13;
          if (uVar11 < 100) {
            __len = __len - 2;
            goto LAB_00149b8e;
          }
          if (uVar11 < 1000) {
            __len = __len - 1;
            goto LAB_00149b8e;
          }
          if (uVar11 < 10000) goto LAB_00149b8e;
          uVar13 = uVar13 / 10000;
          uVar8 = __len + 4;
        } while (99999 < uVar11);
        __len = __len + 1;
      }
LAB_00149b8e:
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct((ulong)local_b0,(char)__len - (char)((int)uVar5 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar5 >> 0x1f) + (long)local_b0[0]),__len,__val);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x14df60);
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_60 = *plVar12;
        lStack_58 = plVar10[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar12;
        local_70 = (long *)*plVar10;
      }
      local_68 = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_40 = *plVar12;
        uStack_38 = (undefined4)plVar10[3];
        uStack_34 = *(undefined4 *)((long)plVar10 + 0x1c);
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar12;
        local_50 = (long *)*plVar10;
      }
      local_48 = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      (*peVar7->_vptr_PSLogger[2])(peVar7,4,local_90);
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      (this->super_TextProvider).m_has_error = true;
      return (this->super_TextProvider).m_current_char;
    }
  }
  (this->super_TextProvider).m_current_char = '\0';
  return '\0';
}

Assistant:

char TextProviderString::advance()
{
	//todo this is probably the wrong way to deal with the fact that contrary to the "get" method on the file, the iterator already points to a valid char if the text is not empty but I'm too tired so this'll work for now.
	//todo it's ugly though and it makes "peek" unusable before "advance". Also, using "reverse" until the beggining of the string would mess it all
	bool avoid_iterator_increment = false;

	if(!m_iterator.has_value())
	{
		m_iterator = m_text.begin();
		avoid_iterator_increment = true;
	}

	if(is_valid())
	{
		++m_current_char_idx;

		if(!avoid_iterator_increment)
		{
			++m_iterator.value();
		}

		if(m_iterator.value() != m_text.end())
		{
			m_current_char = *m_iterator.value();
		}
		else
		{
			m_current_char = '\0';
		}

		if( static_cast<unsigned char>(m_current_char) > 127)
		{
			m_logger->log(PSLogger::LogType::Error, m_parser_text_provider_log_cat,
			"detected non ascii character ( n : "+to_string(m_current_char_idx)+". this interpreter does not yet support unicode files, sorry :/");
			//todo add a line counter in this class to make these function return the correct line
			m_has_error = true;
		}
	}
	else
	{
		m_current_char = '\0';
	}
	return m_current_char;
}